

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddRecursiveImportError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_type __dnew;
  size_type local_38;
  
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_38 = 0x21;
  pcVar3 = (char *)std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_38)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38;
  builtin_strncpy(pcVar3,"File recursively imports itself: ",0x21);
  __return_storage_ptr__->_M_string_length = local_38;
  pcVar3[local_38] = '\0';
  uVar6 = (ulong)**(int **)this;
  plVar2 = *(long **)(lVar1 + 8);
  lVar4 = *plVar2;
  if (uVar6 < (ulong)(plVar2[1] - lVar4 >> 5)) {
    uVar5 = uVar6 << 5 | 8;
    do {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(lVar4 + -8 + uVar5))
      ;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar6 = uVar6 + 1;
      plVar2 = *(long **)(lVar1 + 8);
      lVar4 = *plVar2;
      uVar5 = uVar5 + 0x20;
    } while (uVar6 < (ulong)(plVar2[1] - lVar4 >> 5));
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,
             *(ulong *)(*(ulong *)(*(long *)(this + 0x10) + 200) & 0xfffffffffffffffc));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}